

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_whitelist_sign
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey,uchar *online_seckey,uchar *summed_seckey,size_t index,
              secp256k1_nonce_function noncefp,void *noncedata)

{
  secp256k1_ecmult_gen_context *ctx_00;
  uchar *e0;
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  char *pcVar7;
  secp256k1_scalar *r;
  uchar *b32;
  long lVar8;
  int overflow_1;
  secp256k1_context *local_a120;
  secp256k1_whitelist_signature *local_a118;
  secp256k1_nonce_function local_a110;
  uchar msg32 [32];
  size_t n_keys_local;
  secp256k1_scalar local_a0b8;
  secp256k1_scalar non;
  int overflow;
  uchar nonce32 [32];
  secp256k1_scalar s [256];
  secp256k1_gej pubs [256];
  
  sVar3 = index;
  local_a110 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    local_a110 = noncefp;
  }
  n_keys_local = n_keys;
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)";
  }
  else if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (sig == (secp256k1_whitelist_signature *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "sig != NULL";
  }
  else if (online_pubkeys == (secp256k1_pubkey *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "online_pubkeys != NULL";
  }
  else if (offline_pubkeys == (secp256k1_pubkey *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "offline_pubkeys != NULL";
  }
  else if (n_keys < 0x101) {
    if (sub_pubkey == (secp256k1_pubkey *)0x0) {
      pvVar6 = (ctx->illegal_callback).data;
      pcVar7 = "sub_pubkey != NULL";
    }
    else if (online_seckey == (uchar *)0x0) {
      pvVar6 = (ctx->illegal_callback).data;
      pcVar7 = "online_seckey != NULL";
    }
    else if (summed_seckey == (uchar *)0x0) {
      pvVar6 = (ctx->illegal_callback).data;
      pcVar7 = "summed_seckey != NULL";
    }
    else {
      if (index < n_keys) {
        local_a118 = sig;
        iVar4 = secp256k1_whitelist_compute_keys_and_message
                          (ctx,msg32,pubs,online_pubkeys,offline_pubkeys,(int)n_keys,sub_pubkey);
        if (iVar4 == 0) {
          return 0;
        }
        overflow = 0;
        local_a120 = ctx;
        secp256k1_scalar_set_b32(&local_a0b8,summed_seckey,&overflow);
        if (overflow != 0) {
          return 0;
        }
        if ((local_a0b8.d[3] == 0 && local_a0b8.d[1] == 0) &&
            (local_a0b8.d[2] == 0 && local_a0b8.d[0] == 0)) {
          return 0;
        }
        ctx_00 = &local_a120->ecmult_gen_ctx;
        secp256k1_ecmult_gen(ctx_00,(secp256k1_gej *)s,&local_a0b8);
        iVar4 = secp256k1_whitelist_hash_pubkey(&non,(secp256k1_gej *)s);
        if (iVar4 == 0) {
          return 0;
        }
        secp256k1_scalar_mul(&local_a0b8,&local_a0b8,&non);
        secp256k1_scalar_set_b32(s,online_seckey,&overflow);
        if (overflow != 0) {
          return 0;
        }
        if ((s[0].d[3] == 0 && s[0].d[1] == 0) && (s[0].d[2] == 0 && s[0].d[0] == 0)) {
          return 0;
        }
        secp256k1_scalar_add(&local_a0b8,&local_a0b8,s);
        overflow_1 = 0;
        secp256k1_scalar_get_b32((uchar *)&overflow,&local_a0b8);
        e0 = local_a118->data;
        puVar2 = local_a118->data;
        uVar5 = 0;
        do {
          iVar4 = (*local_a110)(nonce32,msg32,(uchar *)&overflow,(uchar *)0x0,noncedata,uVar5);
          if (iVar4 == 0) {
            return 0;
          }
          secp256k1_scalar_set_b32(&non,nonce32,&overflow_1);
          nonce32[0x10] = '\0';
          nonce32[0x11] = '\0';
          nonce32[0x12] = '\0';
          nonce32[0x13] = '\0';
          nonce32[0x14] = '\0';
          nonce32[0x15] = '\0';
          nonce32[0x16] = '\0';
          nonce32[0x17] = '\0';
          nonce32[0x18] = '\0';
          nonce32[0x19] = '\0';
          nonce32[0x1a] = '\0';
          nonce32[0x1b] = '\0';
          nonce32[0x1c] = '\0';
          nonce32[0x1d] = '\0';
          nonce32[0x1e] = '\0';
          nonce32[0x1f] = '\0';
          nonce32[0] = '\0';
          nonce32[1] = '\0';
          nonce32[2] = '\0';
          nonce32[3] = '\0';
          nonce32[4] = '\0';
          nonce32[5] = '\0';
          nonce32[6] = '\0';
          nonce32[7] = '\0';
          nonce32[8] = '\0';
          nonce32[9] = '\0';
          nonce32[10] = '\0';
          nonce32[0xb] = '\0';
          nonce32[0xc] = '\0';
          nonce32[0xd] = '\0';
          nonce32[0xe] = '\0';
          nonce32[0xf] = '\0';
          if ((overflow_1 == 0) &&
             ((non.d[3] != 0 || non.d[1] != 0) || (non.d[2] != 0 || non.d[0] != 0))) {
            r = s;
            lVar8 = 1;
            b32 = puVar2;
            do {
              b32 = b32 + 0x20;
              if (lVar8 - n_keys == 1) {
                local_a118->n_keys = n_keys;
                iVar4 = secp256k1_borromean_sign
                                  (&local_a120->ecmult_ctx,ctx_00,e0,s,pubs,&non,&local_a0b8,
                                   &n_keys_local,&index,1,msg32,0x20);
                secp256k1_scalar_get_b32(e0 + sVar3 * 0x20 + 0x20,s + sVar3);
                return iVar4;
              }
              msg32[0] = msg32[0] ^ (byte)lVar8;
              bVar1 = (byte)((ulong)lVar8 >> 8);
              msg32[1] = msg32[1] ^ bVar1;
              iVar4 = (*local_a110)(b32,msg32,(uchar *)&overflow,(uchar *)0x0,noncedata,uVar5);
              if (iVar4 == 0) {
                return 0;
              }
              secp256k1_scalar_set_b32(r,b32,&overflow_1);
              msg32[0] = msg32[0] ^ (byte)lVar8;
              msg32[1] = msg32[1] ^ bVar1;
              if (overflow_1 != 0) break;
              iVar4 = secp256k1_scalar_is_zero(r);
              lVar8 = lVar8 + 1;
              r = r + 1;
            } while (iVar4 == 0);
          }
          uVar5 = uVar5 + 1;
        } while( true );
      }
      pvVar6 = (ctx->illegal_callback).data;
      pcVar7 = "index < n_keys";
    }
  }
  else {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "n_keys <= MAX_KEYS";
  }
  (*(ctx->illegal_callback).fn)(pcVar7,pvVar6);
  return 0;
}

Assistant:

int secp256k1_whitelist_sign(const secp256k1_context* ctx, secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey, const unsigned char *online_seckey, const unsigned char *summed_seckey, const size_t index, secp256k1_nonce_function noncefp, const void *noncedata) {
    secp256k1_gej pubs[MAX_KEYS];
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_scalar sec, non;
    unsigned char msg32[32];
    int ret;

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Sanity checks */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(n_keys <= MAX_KEYS);
    ARG_CHECK(sub_pubkey != NULL);
    ARG_CHECK(online_seckey != NULL);
    ARG_CHECK(summed_seckey != NULL);
    ARG_CHECK(index < n_keys);

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    ret = secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, n_keys, sub_pubkey);

    /* Compute signing key: online_seckey + tweaked(summed_seckey) */
    if (ret) {
        ret = secp256k1_whitelist_compute_tweaked_privkey(ctx, &sec, online_seckey, summed_seckey);
    }
    /* Compute nonce and random s-values */
    if (ret) {
        unsigned char seckey32[32];
        unsigned int count = 0;
        int overflow = 0;

        secp256k1_scalar_get_b32(seckey32, &sec);
        while (1) {
            size_t i;
            unsigned char nonce32[32];
            int done;
            ret = noncefp(nonce32, msg32, seckey32, NULL, (void*)noncedata, count);
            if (!ret) {
                break;
            }
            secp256k1_scalar_set_b32(&non, nonce32, &overflow);
            memset(nonce32, 0, 32);
            if (overflow || secp256k1_scalar_is_zero(&non)) {
                count++;
                continue;
            }
            done = 1;
            for (i = 0; i < n_keys; i++) {
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                ret = noncefp(&sig->data[32 * (i + 1)], msg32, seckey32, NULL, (void*)noncedata, count);
                if (!ret) {
                    break;
                }
                secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                if (overflow || secp256k1_scalar_is_zero(&s[i])) {
                    count++;
                    done = 0;
                    break;
                }
            }
            if (done) {
                break;
            }
        }
        memset(seckey32, 0, 32);
    }
    /* Actually sign */
    if (ret) {
        sig->n_keys = n_keys;
        ret = secp256k1_borromean_sign(&ctx->ecmult_ctx, &ctx->ecmult_gen_ctx, &sig->data[0], s, pubs, &non, &sec, &n_keys, &index, 1, msg32, 32);
        /* Signing will change s[index], so update in the sig structure */
        secp256k1_scalar_get_b32(&sig->data[32 * (index + 1)], &s[index]);
    }

    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    return ret;
}